

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_test.cpp
# Opt level: O1

int main(void)

{
  iterator it_00;
  cake_iterator<true> first;
  cake_iterator<true> first_00;
  cake_iterator<true> first_01;
  cake_iterator<false> first_02;
  cake_iterator<false> last;
  cake_iterator<true> last_00;
  cake_iterator<false> last_01;
  cake_iterator<true> last_02;
  cake_iterator<true> last_03;
  cake_iterator<false> last_04;
  cake_iterator<false> last_05;
  undefined1 auVar1 [24];
  undefined1 auVar2 [24];
  undefined1 auVar3 [24];
  int iVar4;
  long lVar5;
  int i;
  ulong uVar6;
  int iVar7;
  char *pcVar8;
  int iVar9;
  iterator it;
  skiplist<int,_std::less<int>_> iskip;
  skiplist<int,_std::less<int>_> uskip;
  skiplist<int,_std::less<int>_> yskip;
  undefined4 in_stack_ffffffffffffe068;
  undefined4 in_stack_ffffffffffffe06c;
  undefined1 in_stack_ffffffffffffe070;
  undefined7 in_stack_ffffffffffffe071;
  undefined8 in_stack_ffffffffffffe078;
  SLNode<int> *pSVar10;
  undefined4 in_stack_ffffffffffffe080;
  undefined4 in_stack_ffffffffffffe084;
  undefined1 in_stack_ffffffffffffe088;
  undefined1 uVar11;
  undefined7 in_stack_ffffffffffffe089;
  iterator local_1e60;
  undefined8 local_1e48;
  undefined1 uStack_1e40;
  undefined8 local_1e38;
  skiplist<int,_std::less<int>_> local_1e30;
  skiplist<int,_std::less<int>_> local_1428;
  skiplist<int,_std::less<int>_> local_a20;
  
  skiplist<int,_std::less<int>_>::skiplist(&local_1e30);
  uVar6 = 0;
  iVar9 = 2;
  do {
    iVar4 = (int)uVar6;
    iVar7 = iVar9;
    if ((iVar9 - 2U & 1) != 0) {
      iVar7 = (int)(uVar6 * 0x24924925 >> 0x20);
      iVar7 = (((uint)(iVar4 - iVar7) >> 1) + iVar7 >> 2) * -7 + iVar4;
    }
    skiplist<int,_std::less<int>_>::insert(&local_1e30,iVar7);
    uVar6 = (ulong)(iVar4 + 1);
    iVar9 = iVar9 + 1;
  } while (iVar9 != 0x17);
  operator<<((ostream *)&std::cout,&local_1e30);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Forward iterator :\n",0x13);
  local_1e38 = 0;
  local_1e48 = 0;
  uStack_1e40 = 0;
  auVar1._4_4_ = in_stack_ffffffffffffe06c;
  auVar1._0_4_ = in_stack_ffffffffffffe068;
  auVar1[8] = in_stack_ffffffffffffe070;
  auVar1._9_7_ = in_stack_ffffffffffffe071;
  auVar1._16_8_ = 0;
  last._8_4_ = in_stack_ffffffffffffe080;
  last.node_count_ = (int)in_stack_ffffffffffffe078;
  last.node_count_ref_ = (int)((ulong)in_stack_ffffffffffffe078 >> 0x20);
  last._12_4_ = in_stack_ffffffffffffe084;
  last.node._0_1_ = in_stack_ffffffffffffe088;
  last.node._1_7_ = in_stack_ffffffffffffe089;
  display<skiplist<int,std::less<int>>::cake_iterator<false>>
            ((cake_iterator<false>)(auVar1 << 0x40),last);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Reverse iterator:\n",0x12);
  pSVar10 = local_1e30.last;
  if (local_1e30.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1e30.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSVar10 = *local_1e30.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
  }
  first._8_4_ = in_stack_ffffffffffffe068;
  first._0_8_ = pSVar10;
  first._12_4_ = in_stack_ffffffffffffe06c;
  first.node._0_1_ = in_stack_ffffffffffffe070;
  first.node._1_7_ = in_stack_ffffffffffffe071;
  last_00._8_4_ = in_stack_ffffffffffffe080;
  last_00.node_count_ = (int)in_stack_ffffffffffffe078;
  last_00.node_count_ref_ = (int)((ulong)in_stack_ffffffffffffe078 >> 0x20);
  last_00._12_4_ = in_stack_ffffffffffffe084;
  last_00.node._0_1_ = in_stack_ffffffffffffe088;
  last_00.node._1_7_ = in_stack_ffffffffffffe089;
  display<skiplist<int,std::less<int>>::cake_iterator<true>>(first,last_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Erasing with iterators:\n",0x18);
  skiplist<int,_std::less<int>_>::find(&local_1e60,&local_1e30,3);
  if ((local_1e60.node == (SLNode<int> *)0x0) && (local_1e60.node_count_ == 0)) {
    lVar5 = 0x15;
    pcVar8 = "Something very wrong\n";
  }
  else {
    it_00.node_count_ref_ = local_1e60.node_count_ref_;
    it_00.node_count_ = local_1e60.node_count_;
    it_00.reverse_ = local_1e60.reverse_;
    it_00._9_7_ = local_1e60._9_7_;
    it_00.node = local_1e60.node;
    skiplist<int,_std::less<int>_>::erase((iterator *)&local_1428,&local_1e30,it_00);
    lVar5 = 0x13;
    pcVar8 = "Erased (I think?) \n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,lVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Forward constant iterator :\n",0x1c);
  auVar2._4_4_ = in_stack_ffffffffffffe06c;
  auVar2._0_4_ = in_stack_ffffffffffffe068;
  auVar2[8] = in_stack_ffffffffffffe070;
  auVar2._9_7_ = in_stack_ffffffffffffe071;
  auVar2._16_8_ = 0;
  last_01._8_4_ = in_stack_ffffffffffffe080;
  last_01.node_count_ = (int)in_stack_ffffffffffffe078;
  last_01.node_count_ref_ = (int)((ulong)in_stack_ffffffffffffe078 >> 0x20);
  last_01._12_4_ = in_stack_ffffffffffffe084;
  last_01.node._0_1_ = in_stack_ffffffffffffe088;
  last_01.node._1_7_ = in_stack_ffffffffffffe089;
  display<skiplist<int,std::less<int>>::cake_iterator<false>>
            ((cake_iterator<false>)(auVar2 << 0x40),last_01);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Reverse constant iterator:\n",0x1b);
  if (local_1e30.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1e30.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_1e30.last =
         *local_1e30.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
          super__Vector_impl_data._M_start;
  }
  first_00._8_4_ = in_stack_ffffffffffffe068;
  first_00._0_8_ = local_1e30.last;
  first_00._12_4_ = in_stack_ffffffffffffe06c;
  first_00.node._0_1_ = in_stack_ffffffffffffe070;
  first_00.node._1_7_ = in_stack_ffffffffffffe071;
  last_02._8_4_ = in_stack_ffffffffffffe080;
  last_02.node_count_ = (int)in_stack_ffffffffffffe078;
  last_02.node_count_ref_ = (int)((ulong)in_stack_ffffffffffffe078 >> 0x20);
  last_02._12_4_ = in_stack_ffffffffffffe084;
  last_02.node._0_1_ = in_stack_ffffffffffffe088;
  last_02.node._1_7_ = in_stack_ffffffffffffe089;
  display<skiplist<int,std::less<int>>::cake_iterator<true>>(first_00,last_02);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nENDL\n\n",7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Creating a new skiplist with the copy constructor:\n",0x33);
  skiplist<int,_std::less<int>_>::skiplist(&local_1428,&local_1e30);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Reverse constant iterator\n",0x1a);
  if (local_1428.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1428.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_1428.last =
         *local_1428.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
          super__Vector_impl_data._M_start;
  }
  first_01._8_4_ = in_stack_ffffffffffffe068;
  first_01._0_8_ = local_1428.last;
  first_01._12_4_ = in_stack_ffffffffffffe06c;
  first_01.node._0_1_ = in_stack_ffffffffffffe070;
  first_01.node._1_7_ = in_stack_ffffffffffffe071;
  last_03._8_4_ = in_stack_ffffffffffffe080;
  last_03.node_count_ = (int)in_stack_ffffffffffffe078;
  last_03.node_count_ref_ = (int)((ulong)in_stack_ffffffffffffe078 >> 0x20);
  last_03._12_4_ = in_stack_ffffffffffffe084;
  last_03.node._0_1_ = in_stack_ffffffffffffe088;
  last_03.node._1_7_ = in_stack_ffffffffffffe089;
  display<skiplist<int,std::less<int>>::cake_iterator<true>>(first_01,last_03);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Deleting elements - 0 20 22\n",0x1c);
  skiplist<int,_std::less<int>_>::erase(&local_1428,0x14);
  skiplist<int,_std::less<int>_>::erase(&local_1428,0);
  skiplist<int,_std::less<int>_>::erase(&local_1428,0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Forward iterator :\n",0x13);
  if (local_1428.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_1428.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar9 = 0;
  }
  else {
    iVar9 = 0;
    if ((*local_1428.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
          super__Vector_impl_data._M_start)->next != (SLNode<int> *)0x0) {
      iVar9 = (*local_1428.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>.
                _M_impl.super__Vector_impl_data._M_start)->next->count + -1;
    }
  }
  uVar11 = 0;
  auVar3._4_4_ = in_stack_ffffffffffffe06c;
  auVar3._0_4_ = in_stack_ffffffffffffe068;
  auVar3[8] = in_stack_ffffffffffffe070;
  auVar3._9_7_ = in_stack_ffffffffffffe071;
  auVar3._16_8_ = 0;
  last_04._8_4_ = iVar9;
  last_04.node_count_ = (int)in_stack_ffffffffffffe078;
  last_04.node_count_ref_ = (int)((ulong)in_stack_ffffffffffffe078 >> 0x20);
  last_04._12_4_ = iVar9;
  last_04.node._0_1_ = 0;
  last_04.node._1_7_ = in_stack_ffffffffffffe089;
  iVar7 = iVar9;
  display<skiplist<int,std::less<int>>::cake_iterator<false>>
            ((cake_iterator<false>)(auVar3 << 0x40),last_04);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nENDL\n\n",7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Creating a new skiplist with the copy assignment operator:\n",
             0x3b);
  skiplist<int,_std::less<int>_>::skiplist(&local_a20,&local_1428);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Forward iterator :\n",0x13);
  if (local_a20.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_a20.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSVar10 = (SLNode<int> *)0x0;
    iVar4 = 0;
  }
  else {
    pSVar10 = (*local_a20.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>.
                _M_impl.super__Vector_impl_data._M_start)->next;
    iVar4 = 0;
    if (pSVar10 != (SLNode<int> *)0x0) {
      iVar4 = pSVar10->count + -1;
    }
  }
  first_02.node._1_7_ = in_stack_ffffffffffffe071;
  first_02._0_17_ = ZEXT817(CONCAT44(iVar4,iVar4)) << 0x40;
  last_05._8_4_ = iVar9;
  last_05._0_8_ = pSVar10;
  last_05._12_4_ = iVar7;
  last_05.node._0_1_ = uVar11;
  last_05.node._1_7_ = in_stack_ffffffffffffe089;
  display<skiplist<int,std::less<int>>::cake_iterator<false>>(first_02,last_05);
  skiplist<int,_std::less<int>_>::~skiplist(&local_a20);
  skiplist<int,_std::less<int>_>::~skiplist(&local_1428);
  skiplist<int,_std::less<int>_>::~skiplist(&local_1e30);
  return 0;
}

Assistant:

int main() {
    skiplist<int> iskip;
    for(int i=0; i<21; i++)
    {
        if(i%2)
            iskip.insert(i%7);
        else
            iskip.insert(i+2);
    }
    std::cout << iskip;

    std::cout << "Forward iterator :\n";
    display(iskip.begin(), iskip.end());

    std::cout << "Reverse iterator:\n";
    display(iskip.rbegin(), iskip.rend());

    std::cout << "Erasing with iterators:\n";
    auto it = iskip.find(3);
    if(it != std::end(iskip)) {
        iskip.erase(it);
        std::cout << "Erased (I think?) \n";
    }
    else
        std::cout << "Something very wrong\n";

    std::cout << "Forward constant iterator :\n";
    display(iskip.cbegin(), iskip.cend());

    std::cout << "Reverse constant iterator:\n";
    display(iskip.crbegin(), iskip.crend());

    std::cout << "\nENDL\n\n";
    std::cout << "Creating a new skiplist with the copy constructor:\n";

    skiplist<int> uskip(iskip);
    std::cout << "Reverse constant iterator\n";
    display(uskip.crbegin(), uskip.crend());
    std::cout << "Deleting elements - 0 20 22\n";
    uskip.erase(20);
    uskip.erase(0);
    uskip.erase(22);
    std::cout << "Forward iterator :\n";
    display(uskip.begin(), uskip.end());

    std::cout << "\nENDL\n\n";
    std::cout << "Creating a new skiplist with the copy assignment operator:\n";

    skiplist<int> yskip = uskip;
    std::cout << "Forward iterator :\n";
    display(yskip.begin(), yskip.end());
}